

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<void_(BasicTestExpr<2>)>::ExplainMatchResultTo
          (TypedExpectation<void_(BasicTestExpr<2>)> *this,ArgumentTuple *args,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  pointer this_00;
  linked_ptr<testing::internal::ExpectationBase> *this_01;
  ostream *in_RDX;
  StringMatchResultListener *in_RDI;
  const_iterator it;
  int i;
  ExpectationSet unsatisfied_prereqs;
  StringMatchResultListener listener;
  StringMatchResultListener *in_stack_fffffffffffffda8;
  StringMatchResultListener *in_stack_fffffffffffffdb0;
  ExpectationBase *in_stack_fffffffffffffdb8;
  ExpectationSet *result;
  ExpectationBase *in_stack_fffffffffffffdc0;
  _Self local_228;
  _Self in_stack_fffffffffffffde0;
  int local_214;
  ostream *in_stack_fffffffffffffdf8;
  ExpectationBase *in_stack_fffffffffffffe00;
  string local_1e0 [456];
  ostream *local_18;
  
  local_18 = in_RDX;
  MutexBase::AssertHeld((MutexBase *)in_stack_fffffffffffffde0._M_node);
  bVar1 = ExpectationBase::is_retired((ExpectationBase *)in_stack_fffffffffffffdb0);
  if (bVar1) {
    poVar2 = std::operator<<(local_18,"         Expected: the expectation is active\n");
    std::operator<<(poVar2,"           Actual: it is retired\n");
  }
  else {
    bVar1 = Matches((TypedExpectation<void_(BasicTestExpr<2>)> *)in_stack_fffffffffffffdc0,
                    (ArgumentTuple *)in_stack_fffffffffffffdb8);
    if (bVar1) {
      bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied(in_stack_fffffffffffffdb8);
      if (bVar1) {
        std::operator<<(local_18,"The call matches the expectation.\n");
      }
      else {
        poVar2 = std::operator<<(local_18,"         Expected: all pre-requisites are satisfied\n");
        poVar2 = std::operator<<(poVar2,"           Actual: the following immediate pre-requisites "
                                );
        std::operator<<(poVar2,"are not satisfied:\n");
        result = (ExpectationSet *)&stack0xfffffffffffffdf0;
        ExpectationSet::ExpectationSet((ExpectationSet *)0x19884a);
        ExpectationBase::FindUnsatisfiedPrerequisites(in_stack_fffffffffffffdc0,result);
        local_214 = 0;
        ExpectationSet::begin((ExpectationSet *)in_stack_fffffffffffffda8);
        while( true ) {
          local_228._M_node =
               (_Base_ptr)ExpectationSet::end((ExpectationSet *)in_stack_fffffffffffffda8);
          bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffde0,&local_228);
          if (!bVar1) break;
          this_00 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                              ((_Rb_tree_const_iterator<testing::Expectation> *)
                               in_stack_fffffffffffffdb0);
          this_01 = Expectation::expectation_base(this_00);
          linked_ptr<testing::internal::ExpectationBase>::operator->(this_01);
          ExpectationBase::DescribeLocationTo(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
          in_stack_fffffffffffffdb0 =
               (StringMatchResultListener *)std::operator<<(local_18,"pre-requisite #");
          in_stack_fffffffffffffda8 =
               (StringMatchResultListener *)
               std::ostream::operator<<(in_stack_fffffffffffffdb0,local_214);
          std::operator<<((ostream *)in_stack_fffffffffffffda8,"\n");
          std::_Rb_tree_const_iterator<testing::Expectation>::operator++
                    ((_Rb_tree_const_iterator<testing::Expectation> *)in_stack_fffffffffffffdb0);
          local_214 = local_214 + 1;
        }
        std::operator<<(local_18,"                   (end of pre-requisites)\n");
        ExpectationSet::~ExpectationSet((ExpectationSet *)0x19895f);
      }
    }
    else {
      bVar1 = TupleMatches<std::tuple<testing::Matcher<BasicTestExpr<2>>>,std::tuple<BasicTestExpr<2>>>
                        ((tuple<testing::Matcher<BasicTestExpr<2>_>_> *)in_stack_fffffffffffffdb0,
                         (tuple<BasicTestExpr<2>_> *)in_stack_fffffffffffffda8);
      if (!bVar1) {
        ExplainMatchFailureTupleTo<std::tuple<testing::Matcher<BasicTestExpr<2>>>,std::tuple<BasicTestExpr<2>>>
                  ((tuple<testing::Matcher<BasicTestExpr<2>_>_> *)in_stack_fffffffffffffdb0,
                   (tuple<BasicTestExpr<2>_> *)in_stack_fffffffffffffda8,(ostream *)0x1986c8);
      }
      StringMatchResultListener::StringMatchResultListener(in_RDI);
      bVar1 = MatcherBase<const_std::tuple<BasicTestExpr<2>_>_&>::MatchAndExplain
                        ((MatcherBase<const_std::tuple<BasicTestExpr<2>_>_&> *)
                         in_stack_fffffffffffffdb0,
                         (tuple<BasicTestExpr<2>_> *)in_stack_fffffffffffffda8,
                         (MatchResultListener *)0x1986f8);
      if (!bVar1) {
        std::operator<<(local_18,"    Expected args: ");
        MatcherBase<const_std::tuple<BasicTestExpr<2>_>_&>::DescribeTo
                  ((MatcherBase<const_std::tuple<BasicTestExpr<2>_>_&> *)in_stack_fffffffffffffdb0,
                   (ostream *)in_stack_fffffffffffffda8);
        std::operator<<(local_18,"\n           Actual: don\'t match");
        StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffda8);
        PrintIfNotEmpty((string *)in_stack_fffffffffffffdb0,(ostream *)in_stack_fffffffffffffda8);
        std::__cxx11::string::~string(local_1e0);
        std::operator<<(local_18,"\n");
      }
      StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdb0);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }